

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

void __thiscall QLineEditPrivate::removeAction(QLineEditPrivate *this,QAction *action)

{
  undefined8 *puVar1;
  uint uVar2;
  QWidget *this_00;
  long lVar3;
  QWidget *widget;
  void **ppvVar4;
  SideWidgetLocation SVar5;
  ulong uVar6;
  QWidgetAction *this_01;
  undefined4 *puVar7;
  undefined8 *puVar8;
  undefined8 *__src;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  SVar5 = findSideWidget(this,action);
  if (-1 < (long)SVar5) {
    uVar6 = (ulong)SVar5 >> 0x20;
    lVar10 = 0x2c0;
    if (SVar5.position == TrailingPosition) {
      lVar10 = 0x2d8;
    }
    lVar3 = *(long *)(&(this->super_QWidgetPrivate).super_QObjectPrivate + lVar10);
    puVar8 = *(undefined8 **)(&(this->super_QWidgetPrivate).field_0x8 + lVar10);
    uVar9 = ((long)puVar8 - lVar3 >> 3) * -0x5555555555555555;
    if (uVar9 < uVar6 || uVar9 - uVar6 == 0) {
      removeAction();
      goto LAB_00421842;
    }
    puVar1 = (undefined8 *)(lVar3 + uVar6 * 0x18);
    __src = puVar1 + 3;
    widget = (QWidget *)*puVar1;
    uVar2 = *(uint *)(puVar1 + 2);
    if (__src != puVar8) {
      memmove((void *)(lVar3 + uVar6 * 0x18),__src,(long)puVar8 - (long)__src);
      puVar8 = *(undefined8 **)(&(this->super_QWidgetPrivate).field_0x8 + lVar10);
    }
    *(undefined8 **)(&(this->super_QWidgetPrivate).field_0x8 + lVar10) = puVar8 + -3;
    if ((uVar2 & 2) == 0) {
      if (widget != (QWidget *)0x0) {
        (**(code **)(*(long *)widget + 0x20))(widget);
      }
    }
    else {
      this_01 = (QWidgetAction *)QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
      if (this_01 != (QWidgetAction *)0x0) {
        QWidgetAction::releaseWidget(this_01,widget);
      }
    }
    positionSideWidgets(this);
    if (((this->leadingSideWidgets).
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->leadingSideWidgets).
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->trailingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->trailingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_48 = QLineEdit::textChanged;
      local_40 = 0;
      local_58 = textChanged;
      local_50 = (ImplFn)0x0;
      ppvVar4 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
      puVar7 = (undefined4 *)operator_new(0x20);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QPrivateSlotObject<void_(QLineEditPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
           ::impl;
      *(code **)(puVar7 + 4) = textChanged;
      *(undefined8 *)(puVar7 + 6) = 0;
      QObject::connectImpl
                (local_60,(void **)this_00,(QObject *)&local_48,ppvVar4,(QSlotObjectBase *)&local_58
                 ,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_60);
    }
    QWidget::update(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00421842:
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::removeAction(QAction *action)
{
    Q_Q(QLineEdit);
    const auto location = findSideWidget(action);
    if (!location.isValid())
        return;
    SideWidgetEntryList &list = location.position == QLineEdit::TrailingPosition ? trailingSideWidgets : leadingSideWidgets;
    SideWidgetEntry entry = list[location.index];
    list.erase(list.begin() + location.index);
    if (entry.flags & SideWidgetCreatedByWidgetAction) {
        // If the cast fails, the QAction is in the process of being deleted
        // and has already ceased to be a QWidgetAction; in the process, it
        // will release its widget itself, and calling releaseWidget() here
        // would be UB, so don't:
        if (const auto a = qobject_cast<QWidgetAction*>(entry.action))
            a->releaseWidget(entry.widget);
    } else {
         delete entry.widget;
    }
     positionSideWidgets();
     if (!hasSideWidgets()) // Last widget, remove connection
         QObjectPrivate::connect(q, &QLineEdit::textChanged,
                                 this, &QLineEditPrivate::textChanged);
     q->update();
}